

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool IsZero(expr_node *node)

{
  if (((node != (expr_node *)0x0) && (node->type == '\x01')) && ((node->value).integer == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool IsZero(const expr_node* node)
{
    if (node == nullptr)
        return false;
    
    if (node->type == INT && node->value.integer == 0)
        return true;
    else
        return false;
}